

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void printDualSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  int iVar1;
  bool bVar2;
  Verbosity VVar3;
  int iVar4;
  element_type *peVar5;
  SPxOut *pSVar6;
  SPxOut *o;
  byte in_CL;
  long in_RDI;
  byte in_R8B;
  Real __x;
  double dVar7;
  Verbosity old_verbosity_19;
  Verbosity old_verbosity_18;
  Verbosity old_verbosity_17;
  int i_5;
  Verbosity old_verbosity_16;
  VectorRational redcost_1;
  Verbosity old_verbosity_15;
  Verbosity old_verbosity_14;
  int i_4;
  Verbosity old_verbosity_13;
  Verbosity old_verbosity_12;
  Verbosity old_verbosity_11;
  int i_3;
  Verbosity old_verbosity_10;
  VectorRational dual_1;
  Verbosity old_verbosity_9;
  Verbosity old_verbosity_8;
  Verbosity old_verbosity_7;
  int i_2;
  Verbosity old_verbosity_6;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  redcost;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  int i_1;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  int i;
  Verbosity old_verbosity;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dual;
  int printwidth;
  int printprec;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff6a8;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff6b0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff6b8;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_fffffffffffff6c0;
  SPxOut *in_stack_fffffffffffff6f8;
  SPxOut *in_stack_fffffffffffff700;
  SPxOut *in_stack_fffffffffffff708;
  double in_stack_fffffffffffff718;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff720;
  Verbosity local_628;
  Verbosity local_624 [3];
  undefined1 local_618 [68];
  Verbosity local_5d4;
  Verbosity local_5d0 [2];
  undefined1 local_5c8 [68];
  int local_584;
  Verbosity local_580;
  Verbosity local_57c [7];
  Verbosity local_560;
  Verbosity local_55c;
  undefined1 local_558 [68];
  Verbosity local_514;
  Verbosity local_510 [2];
  undefined1 local_508 [76];
  int local_4bc;
  Verbosity local_4b8;
  Verbosity local_4b4 [3];
  undefined1 local_4a8 [76];
  int local_45c;
  int local_458;
  Verbosity local_454;
  Verbosity local_450 [2];
  undefined1 local_448 [76];
  int local_3fc;
  Verbosity local_3f8;
  Verbosity local_3f4 [8];
  Verbosity local_3d4;
  Verbosity local_3d0;
  int local_3cc;
  int local_3b4;
  Verbosity local_3b0;
  Verbosity local_3ac;
  undefined1 local_3a8 [56];
  int local_370;
  int local_36c;
  Verbosity local_368;
  Verbosity local_364 [6];
  undefined1 local_34c [56];
  int local_314;
  Verbosity local_310;
  Verbosity local_30c [8];
  int local_2ec;
  int local_2d4;
  Verbosity local_2d0;
  Verbosity local_2cc;
  undefined1 local_2c8 [56];
  int local_290;
  int local_28c;
  Verbosity local_288;
  Verbosity local_284 [5];
  undefined1 local_270 [56];
  int local_238;
  Verbosity local_234;
  Verbosity local_230;
  int local_22c;
  int local_214;
  Verbosity local_210;
  Verbosity local_20c;
  undefined1 local_208 [56];
  int local_1d0;
  int local_1cc;
  Verbosity local_1c8;
  Verbosity local_1c4 [6];
  undefined1 local_1ac [56];
  int local_174;
  Verbosity local_170;
  Verbosity local_16c [16];
  int local_12c;
  int local_128;
  byte local_122;
  byte local_121;
  long local_110;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_f8;
  undefined1 *local_f0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_e8;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  Verbosity *local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  Verbosity *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  Verbosity *local_88;
  undefined1 *local_80;
  Verbosity *local_78;
  Verbosity *local_70;
  Verbosity *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  undefined1 *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_121 = in_CL & 1;
  local_122 = in_R8B & 1;
  local_110 = in_RDI;
  ::soplex::
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_fffffffffffff6a8);
  peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x14ed3f);
  __x = ::soplex::Tolerances::epsilon(peVar5);
  dVar7 = log10(__x);
  local_128 = (int)-dVar7;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x14ed8f);
  local_12c = local_128 + 10;
  if ((local_121 & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x14edbb);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
    bVar2 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getDualFarkas(in_stack_fffffffffffff6b8,
                            (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffff6b0);
    if (bVar2) {
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_16c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_170 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_170);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_16c);
      }
      for (local_174 = 0; iVar1 = local_174,
          iVar4 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x14ef0e), iVar1 < iVar4; local_174 = local_174 + 1) {
        local_60 = ::soplex::
                   VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffff6b0,
                                (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
        local_58 = local_1ac;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6b0,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6a8);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff6a8);
        peVar5 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14ef98);
        ::soplex::Tolerances::epsilon(peVar5);
        bVar2 = ::soplex::
                isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (in_stack_fffffffffffff720,in_stack_fffffffffffff718);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x14efd7)
        ;
        if (((bVar2) && (local_110 != -8)) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_1c4[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_1c8 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_1c8);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff6b0,
                     (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
          local_1cc = (int)std::setw(local_12c);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6a8,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
          local_1d0 = (int)std::setprecision(local_128);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6a8,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
          local_50 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff6b0,
                                  (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
          local_48 = local_208;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6b0,
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6a8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff6a8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff6a8);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_1c4);
        }
      }
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_20c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_210 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_210);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
        local_214 = (int)std::setprecision(1);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff6a8,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff6b0,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff6a8);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff6a8);
        peVar5 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14f310);
        ::soplex::Tolerances::epsilon(peVar5);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff6b0,(double)in_stack_fffffffffffff6a8);
        local_22c = (int)std::setprecision(8);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff6a8,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff6b0,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff6a8);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff6b0,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff6a8);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x14f3d1)
        ;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_20c);
      }
    }
    else {
      bVar2 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isDualFeasible(in_stack_fffffffffffff6b0);
      if ((bVar2) &&
         (bVar2 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::getDual(in_stack_fffffffffffff6b8,
                            (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffff6b0), bVar2)) {
        if ((local_110 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_230 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_234 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_234);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_230);
        }
        for (local_238 = 0; iVar1 = local_238,
            iVar4 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x14f536), iVar1 < iVar4; local_238 = local_238 + 1) {
          local_40 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff6b0,
                                  (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
          local_38 = local_270;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6b0,
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6a8);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff6a8);
          peVar5 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x14f5c0);
          ::soplex::Tolerances::epsilon(peVar5);
          bVar2 = ::soplex::
                  isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (in_stack_fffffffffffff720,in_stack_fffffffffffff718);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x14f5ff);
          if (((bVar2) && (local_110 != -8)) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
            local_284[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
            local_288 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_288);
            ::soplex::NameSet::operator[]
                      ((NameSet *)in_stack_fffffffffffff6b0,
                       (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
            local_28c = (int)std::setw(local_12c);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6a8,
                       (_Setw)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
            local_290 = (int)std::setprecision(local_128);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6a8,
                       (_Setprecision)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
            local_30 = ::soplex::
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)in_stack_fffffffffffff6b0,
                                    (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
            local_28 = local_2c8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6b0,
                       (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6a8);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff6a8);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff6a8);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_284);
          }
        }
        if ((local_110 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_2cc = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_2d0 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_2d0);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
          local_2d4 = (int)std::setprecision(1);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6a8,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff6a8);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff6a8);
          peVar5 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x14f938);
          ::soplex::Tolerances::epsilon(peVar5);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,(double)in_stack_fffffffffffff6a8);
          local_2ec = (int)std::setprecision(8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6a8,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff6a8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff6a8);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x14f9f9);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_2cc);
        }
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x14fa49);
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
        bVar2 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRedCost(in_stack_fffffffffffff6b8,
                             (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff6b0);
        if (bVar2) {
          if ((local_110 != -8) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
            local_30c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
            local_310 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_310);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_30c);
          }
          for (local_314 = 0; iVar1 = local_314,
              iVar4 = ::soplex::
                      SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x14fb7e), iVar1 < iVar4; local_314 = local_314 + 1) {
            local_20 = ::soplex::
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)in_stack_fffffffffffff6b0,
                                    (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
            local_18 = local_34c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6b0,
                       (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6a8);
            ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::tolerances(in_stack_fffffffffffff6a8);
            peVar5 = std::
                     __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x14fc08);
            ::soplex::Tolerances::epsilon(peVar5);
            bVar2 = ::soplex::
                    isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                              (in_stack_fffffffffffff720,in_stack_fffffffffffff718);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x14fc47);
            if (((bVar2) && (local_110 != -8)) &&
               (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3))
            {
              local_364[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
              local_368 = INFO1;
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_368);
              ::soplex::NameSet::operator[]
                        ((NameSet *)in_stack_fffffffffffff6b0,
                         (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
              local_36c = (int)std::setw(local_12c);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff6a8,
                         (_Setw)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
              local_370 = (int)std::setprecision(local_128);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff6a8,
                         (_Setprecision)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
              local_10 = ::soplex::
                         VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)in_stack_fffffffffffff6b0,
                                      (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
              local_8 = local_3a8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6b0,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff6a8);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff6b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff6a8);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff6b0,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff6a8);
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_364);
            }
          }
          if ((local_110 != -8) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
            local_3ac = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
            local_3b0 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_3b0);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
            local_3b4 = (int)std::setprecision(1);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6a8,
                       (_Setprecision)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,
                       (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff6a8);
            ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::tolerances(in_stack_fffffffffffff6a8);
            peVar5 = std::
                     __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x14ff80);
            ::soplex::Tolerances::epsilon(peVar5);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,(double)in_stack_fffffffffffff6a8);
            local_3cc = (int)std::setprecision(8);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6a8,
                       (_Setprecision)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,
                       (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff6a8);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff6a8);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x150041);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_3ac);
          }
        }
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x150090);
      }
      else if ((local_110 != -8) &&
              (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_3d0 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_3d4 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_3d4);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_3d0);
      }
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x15015b);
  }
  if ((local_122 & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x15018a);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
    bVar2 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getDualFarkasRational
                      (in_stack_fffffffffffff6b8,
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff6b0);
    if (bVar2) {
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_3f4[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_3f8 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_3f8);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_3f4);
      }
      for (local_3fc = 0; iVar1 = local_3fc,
          iVar4 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x1502b7), iVar1 < iVar4; local_3fc = local_3fc + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff6b0,(int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
        local_450[1] = 0;
        local_c0 = local_448;
        local_c8 = local_450 + 1;
        local_d0 = 0;
        local_d8 = 0;
        local_68 = local_c8;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff708,(longlong *)in_stack_fffffffffffff700,
                   in_stack_fffffffffffff6f8);
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff6a8,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x15037e);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x150394);
        if (((bVar2) && (local_110 != -8)) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_450[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_454 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_454);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff6b0,
                     (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
          local_458 = (int)std::setw(local_12c);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6a8,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
          local_45c = (int)std::setprecision(local_128);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6a8,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
          local_108 = ::soplex::
                      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                    *)in_stack_fffffffffffff6b0,
                                   (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
          local_100 = local_4a8;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor(in_stack_fffffffffffff6c0,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff6b8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffff6a8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff6a8);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x15056e);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_450);
        }
      }
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_4b4[2] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_4b4[1] = 3;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_4b4 + 1);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff6b0,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff6a8);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_4b4 + 2);
      }
    }
    bVar2 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isDualFeasible(in_stack_fffffffffffff6b0);
    if ((bVar2) &&
       (bVar2 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getDualRational(in_stack_fffffffffffff6b8,
                                  (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffff6b0), bVar2)) {
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_4b4[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_4b8 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_4b8);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_4b4);
      }
      for (local_4bc = 0; iVar1 = local_4bc,
          iVar4 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x1507d5), iVar1 < iVar4; local_4bc = local_4bc + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff6b0,(int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
        local_510[1] = 0;
        local_a0 = local_508;
        local_a8 = local_510 + 1;
        local_b0 = 0;
        local_b8 = 0;
        local_70 = local_a8;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff708,(longlong *)in_stack_fffffffffffff700,
                   in_stack_fffffffffffff6f8);
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff6a8,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x15089c);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1508b2);
        if (((bVar2) && (local_110 != -8)) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_510[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_514 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_514);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff6b0,
                     (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
          in_stack_fffffffffffff708 =
               ::soplex::operator<<
                         ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
          local_f8 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffff6b0,
                                  (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
          local_f0 = local_558;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor(in_stack_fffffffffffff6c0,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff6b8);
          in_stack_fffffffffffff700 =
               ::soplex::operator<<
                         ((SPxOut *)in_stack_fffffffffffff6b0,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)in_stack_fffffffffffff6a8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff6a8);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x150a0c);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_510);
        }
      }
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_55c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_560 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_560);
        in_stack_fffffffffffff6f8 =
             ::soplex::operator<<
                       ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff6b0,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff6a8);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_55c);
      }
      ::soplex::
      SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x150b5b);
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
      bVar2 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getRedCostRational
                        (in_stack_fffffffffffff6b8,(VectorRational *)in_stack_fffffffffffff6b0);
      if (bVar2) {
        if ((local_110 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_57c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_580 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_580);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_57c);
        }
        for (local_584 = 0; iVar1 = local_584,
            iVar4 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x150c81), iVar1 < iVar4; local_584 = local_584 + 1) {
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff6b0,(int)((ulong)in_stack_fffffffffffff6a8 >> 0x20))
          ;
          local_5d0[1] = 0;
          local_80 = local_5c8;
          local_88 = local_5d0 + 1;
          local_90 = 0;
          local_98 = 0;
          local_78 = local_88;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)in_stack_fffffffffffff708,(longlong *)in_stack_fffffffffffff700,
                     in_stack_fffffffffffff6f8);
          bVar2 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)in_stack_fffffffffffff6a8,
                             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)0x150d39);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x150d4c);
          if (((bVar2) && (local_110 != -8)) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
            local_5d0[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
            local_5d4 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_5d4);
            ::soplex::NameSet::operator[]
                      ((NameSet *)in_stack_fffffffffffff6b0,
                       (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
            pSVar6 = ::soplex::operator<<
                               ((SPxOut *)in_stack_fffffffffffff6b0,
                                (char *)in_stack_fffffffffffff6a8);
            o = ::soplex::operator<<
                          ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
            local_e8 = ::soplex::
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff6b0,
                                    (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
            local_e0 = local_618;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)pSVar6,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)o);
            in_stack_fffffffffffff6b0 =
                 (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)::soplex::operator<<
                              ((SPxOut *)in_stack_fffffffffffff6b0,
                               (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)in_stack_fffffffffffff6a8);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff6b0,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff6a8);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x150ea3);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_5d0);
          }
        }
        if ((local_110 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_624[2] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_624[1] = 3;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_624 + 1);
          pSVar6 = ::soplex::operator<<
                             ((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8)
          ;
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff6b0,(_func_ostream_ptr_ostream_ptr *)pSVar6);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_624 + 2);
        }
      }
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)0x150ff2);
    }
    else if ((local_110 != -8) &&
            (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
      local_624[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
      local_628 = INFO1;
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_628);
      ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_624);
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x1510bb);
  }
  return;
}

Assistant:

static
void printDualSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                       bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> dual(soplex.numRows());

      if(soplex.getDualFarkas(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)
      }
      else if(soplex.isDualFeasible() && soplex.getDual(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)

         VectorBase<R> redcost(soplex.numCols());

         if(soplex.getRedCost(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(isNotZero(redcost[i], soplex.tolerances()->epsilon()))
               {
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                                << std::setw(printwidth) << std::setprecision(printprec)
                                << redcost[i] << std::endl;)
               }
            }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero (within "
                          << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                          << std::setprecision(8) << std::fixed << ")." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual information available.\n")
      }

   if(rational)
   {
      VectorRational dual(soplex.numRows());

      if(soplex.getDualFarkasRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(dual[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth)
                             << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isDualFeasible() && soplex.getDualRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRowsRational(); ++i)
         {
            if(dual[i] != (Rational) 0)
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t" << dual[i] << std::endl;)
            }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero." << std::endl;)

         VectorRational redcost(soplex.numCols());

         if(soplex.getRedCostRational(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(redcost[i] != (Rational) 0)
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << redcost[i] << std::endl;)
               }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual (rational) solution available.\n")
      }
}